

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdjpgcom.c
# Opt level: O1

int scan_JPEG_header(int verbose,int raw)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int extraout_EAX;
  ushort **ppuVar9;
  char *pcVar10;
  FILE *pFVar11;
  ulong uVar12;
  
  iVar1 = getc((FILE *)infile);
  pFVar11 = infile;
  iVar2 = getc((FILE *)infile);
  iVar3 = (int)pFVar11;
  if ((iVar1 == 0xff) && (iVar2 == 0xd8)) {
LAB_00101609:
    do {
      while( true ) {
        iVar2 = read_1_byte();
        iVar1 = iVar2;
        while (iVar1 != 0xff) {
          iVar1 = read_1_byte();
        }
        do {
          iVar1 = read_1_byte();
        } while (iVar1 == 0xff);
        iVar3 = iVar1;
        if (iVar2 != 0xff) {
          scan_JPEG_header_cold_1();
          iVar3 = extraout_EAX;
        }
        if (iVar1 < 0xc9) break;
        if (iVar1 < 0xcd) {
          uVar4 = iVar1 - 0xc9;
LAB_0010167d:
          if (uVar4 < 3) goto LAB_00101686;
          goto LAB_0010177d;
        }
        if (iVar1 < 0xd9) {
          uVar4 = iVar1 - 0xcd;
          goto LAB_0010167d;
        }
        if (iVar1 == 0xec) {
          if (verbose != 0) {
            puts("APP12 contains:");
            goto LAB_0010176f;
          }
          goto LAB_0010177d;
        }
        if (iVar1 != 0xfe) {
          if (iVar1 - 0xd9U < 2) {
            return iVar3;
          }
          goto LAB_0010177d;
        }
LAB_0010176f:
        process_COM(raw);
      }
      if (3 < iVar1 - 0xc0U) {
        uVar4 = iVar1 - 0xc5;
        goto LAB_0010167d;
      }
LAB_00101686:
      if (verbose != 0) {
        uVar4 = read_2_bytes();
        uVar5 = read_1_byte();
        uVar6 = read_2_bytes();
        uVar7 = read_2_bytes();
        uVar8 = read_1_byte();
        uVar12 = (ulong)uVar8;
        pcVar10 = "Unknown";
        if (iVar1 - 0xc0U < 0x10) {
          pcVar10 = &DAT_001023a0 + *(int *)(&DAT_001023a0 + (ulong)(iVar1 - 0xc0U) * 4);
        }
        printf("JPEG image is %uw * %uh, %d color components, %d bits per sample\n",(ulong)uVar7,
               (ulong)uVar6,uVar12,(ulong)uVar5);
        iVar3 = 0x10233c;
        printf("JPEG process: %s\n",pcVar10);
        if (uVar4 != uVar8 * 3 + 8) {
          scan_JPEG_header_cold_2();
          break;
        }
        if (0 < (int)uVar8) {
          do {
            read_1_byte();
            read_1_byte();
            read_1_byte();
            uVar4 = (int)uVar12 - 1;
            uVar12 = (ulong)uVar4;
          } while (uVar4 != 0);
        }
        goto LAB_00101609;
      }
LAB_0010177d:
      skip_variable();
    } while( true );
  }
  scan_JPEG_header_cold_3();
  uVar4 = read_2_bytes();
  if (1 < uVar4) {
    for (iVar1 = uVar4 - 2; iVar1 != 0; iVar1 = iVar1 + -1) {
      uVar4 = read_1_byte();
    }
    return uVar4;
  }
  skip_variable_cold_1();
  setlocale(0,"");
  uVar4 = read_2_bytes();
  if (uVar4 < 2) {
    process_COM_cold_1();
    iVar1 = getc((FILE *)infile);
    if (iVar1 != -1) {
      return iVar1;
    }
    read_1_byte_cold_1();
    iVar1 = getc((FILE *)infile);
    if (iVar1 == -1) {
      read_2_bytes_cold_2();
    }
    else {
      iVar2 = getc((FILE *)infile);
      if (iVar2 != -1) {
        return iVar2 + iVar1 * 0x100;
      }
    }
    read_2_bytes_cold_1();
    halt_baddata();
  }
  iVar1 = uVar4 - 2;
  if (iVar1 != 0) {
    uVar4 = 0;
    do {
      uVar5 = read_1_byte();
      if (iVar3 == 0) {
        if (uVar5 == 10) {
          if (uVar4 != 0xd) {
LAB_0010187b:
            putchar(10);
          }
        }
        else if (uVar5 == 0x5c) {
          printf("\\\\");
        }
        else {
          if (uVar5 == 0xd) goto LAB_0010187b;
          ppuVar9 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar9 + (long)(int)uVar5 * 2 + 1) & 0x40) != 0) goto LAB_00101820;
          printf("\\%03o",(ulong)uVar5);
        }
      }
      else {
LAB_00101820:
        putc(uVar5,_stdout);
      }
      iVar1 = iVar1 + -1;
      uVar4 = uVar5;
    } while (iVar1 != 0);
  }
  putchar(10);
  pcVar10 = setlocale(0,"C");
  return (int)pcVar10;
}

Assistant:

static int
scan_JPEG_header(int verbose, int raw)
{
  int marker;

  /* Expect SOI at start of file */
  if (first_marker() != M_SOI)
    ERREXIT("Expected SOI marker first");

  /* Scan miscellaneous markers until we reach SOS. */
  for (;;) {
    marker = next_marker();
    switch (marker) {
      /* Note that marker codes 0xC4, 0xC8, 0xCC are not, and must not be,
       * treated as SOFn.  C4 in particular is actually DHT.
       */
    case M_SOF0:                /* Baseline */
    case M_SOF1:                /* Extended sequential, Huffman */
    case M_SOF2:                /* Progressive, Huffman */
    case M_SOF3:                /* Lossless, Huffman */
    case M_SOF5:                /* Differential sequential, Huffman */
    case M_SOF6:                /* Differential progressive, Huffman */
    case M_SOF7:                /* Differential lossless, Huffman */
    case M_SOF9:                /* Extended sequential, arithmetic */
    case M_SOF10:               /* Progressive, arithmetic */
    case M_SOF11:               /* Lossless, arithmetic */
    case M_SOF13:               /* Differential sequential, arithmetic */
    case M_SOF14:               /* Differential progressive, arithmetic */
    case M_SOF15:               /* Differential lossless, arithmetic */
      if (verbose)
        process_SOFn(marker);
      else
        skip_variable();
      break;

    case M_SOS:                 /* stop before hitting compressed data */
      return marker;

    case M_EOI:                 /* in case it's a tables-only JPEG stream */
      return marker;

    case M_COM:
      process_COM(raw);
      break;

    case M_APP12:
      /* Some digital camera makers put useful textual information into
       * APP12 markers, so we print those out too when in -verbose mode.
       */
      if (verbose) {
        printf("APP12 contains:\n");
        process_COM(raw);
      } else
        skip_variable();
      break;

    default:                    /* Anything else just gets skipped */
      skip_variable();          /* we assume it has a parameter count... */
      break;
    }
  } /* end loop */
}